

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

void __thiscall HighsLpRelaxation::performAging(HighsLpRelaxation *this,bool deleteRows)

{
  double *pdVar1;
  HighsMipSolver *pHVar2;
  pointer pLVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  size_type sVar7;
  long lVar8;
  size_type __new_size;
  int iVar9;
  double dVar10;
  int local_4c;
  vector<int,_std::allocator<int>_> deletemask;
  
  if ((((this->lpsolver).info_.super_HighsInfoStruct.basis_validity != 0) &&
      (dVar10 = (this->lpsolver).info_.super_HighsInfoStruct.max_dual_infeasibility,
      pHVar2 = this->mipsolver,
      pdVar1 = &((pHVar2->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol,
      dVar10 < *pdVar1 || dVar10 == *pdVar1)) && ((this->lpsolver).solution_.dual_valid == true)) {
    if (deleteRows) {
      iVar9 = (pHVar2->options_mip_->super_HighsOptionsStruct).mip_lp_age_limit;
      uVar4 = this->epochs + 1;
      this->epochs = uVar4;
      uVar6 = 2;
      if (2 < iVar9 >> 1) {
        uVar6 = (ulong)(uint)(iVar9 >> 1);
      }
      local_4c = 0x7fffffff;
      if ((uVar4 % uVar6 == 0) && (local_4c = (int)uVar4, iVar9 < (int)uVar4)) {
        local_4c = iVar9;
      }
    }
    else {
      local_4c = 0x7fffffff;
      if (this->lastAgeCall == this->numlpiters) {
        return;
      }
    }
    this->lastAgeCall = this->numlpiters;
    __new_size = (size_type)(this->lpsolver).model_.lp_.num_row_;
    sVar7 = (size_type)pHVar2->model_->num_row_;
    deletemask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    deletemask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    deletemask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lVar8 = sVar7 * 0xc;
    iVar9 = 0;
    for (; __new_size != sVar7; sVar7 = sVar7 + 1) {
      if ((this->lpsolver).basis_.row_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[sVar7] == kBasic) {
        pLVar3 = (this->lprows).
                 super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar5 = *(int *)((long)&pLVar3->age + lVar8);
        iVar5 = (uint)(iVar5 != 0 || deleteRows) + iVar5;
        *(int *)((long)&pLVar3->age + lVar8) = iVar5;
        if (local_4c < iVar5) {
          if (iVar9 == 0) {
            std::vector<int,_std::allocator<int>_>::resize(&deletemask,__new_size);
            pLVar3 = (this->lprows).
                     super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          deletemask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar7] = 1;
          HighsCutPool::lpCutRemoved
                    (&((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool,
                     *(HighsInt *)((long)&pLVar3->index + lVar8));
          iVar9 = iVar9 + 1;
        }
      }
      else {
        dVar10 = ABS((this->lpsolver).solution_.row_dual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar7]);
        pdVar1 = &(this->lpsolver).options_.super_HighsOptionsStruct.dual_feasibility_tolerance;
        if (*pdVar1 <= dVar10 && dVar10 != *pdVar1) {
          *(undefined4 *)
           ((long)&((this->lprows).
                    super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                    ._M_impl.super__Vector_impl_data._M_start)->age + lVar8) = 0;
        }
      }
      lVar8 = lVar8 + 0xc;
    }
    removeCuts(this,iVar9,&deletemask);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&deletemask.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void HighsLpRelaxation::performAging(bool deleteRows) {
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
  HighsInt agelimit;

  if (lpsolver.getInfo().basis_validity == kBasisValidityInvalid ||
      lpsolver.getInfo().max_dual_infeasibility > mipsolver.mipdata_->feastol ||
      !lpsolver.getSolution().dual_valid)
    return;

  if (deleteRows) {
    agelimit = mipsolver.options_mip_->mip_lp_age_limit;

    ++epochs;
    if (epochs % std::max(agelimit >> 1, HighsInt{2}) != 0)
      agelimit = kHighsIInf;
    else if ((HighsInt)epochs < agelimit)
      agelimit = epochs;
  } else {
    if (lastAgeCall == numlpiters) return;
    agelimit = kHighsIInf;
  }

  lastAgeCall = numlpiters;

  HighsInt nlprows = numRows();
  HighsInt nummodelrows = getNumModelRows();
  std::vector<HighsInt> deletemask;

  HighsInt ndelcuts = 0;
  for (HighsInt i = nummodelrows; i != nlprows; ++i) {
    assert(lprows[i].origin == LpRow::Origin::kCutPool);
    if (lpsolver.getBasis().row_status[i] == HighsBasisStatus::kBasic) {
      lprows[i].age += (deleteRows || lprows[i].age != 0);
      if (lprows[i].age > agelimit) {
        if (ndelcuts == 0) deletemask.resize(nlprows);
        ++ndelcuts;
        deletemask[i] = 1;
        mipsolver.mipdata_->cutpool.lpCutRemoved(lprows[i].index);
      }
    } else if (std::abs(lpsolver.getSolution().row_dual[i]) >
               lpsolver.getOptions().dual_feasibility_tolerance) {
      lprows[i].age = 0;
    }
  }

  removeCuts(ndelcuts, deletemask);
}